

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_states.cpp
# Opt level: O3

void __thiscall
SMC::sample_distance
          (SMC *this,Atom *b,Atom *c,Atom *B,double theta,double lcd,Atom *p,double lcon,int label,
          int rem)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  Atom *A;
  undefined4 uVar17;
  undefined4 uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  Atom p2;
  Atom p1;
  double pdf [32];
  double cdf [32];
  double dStack_3f0;
  double local_3d8;
  undefined8 uStack_3d0;
  double dStack_3c0;
  double local_368;
  double dStack_340;
  double dStack_320;
  undefined1 local_2f8 [16];
  double local_2e8;
  Atom local_2d8;
  Atom local_288;
  double local_238 [31];
  double local_140 [34];
  
  dVar2 = (b->super_Point).z;
  dVar3 = (c->super_Point).z;
  dVar21 = dVar2 - dVar3;
  dVar20 = (b->super_Point).x;
  dVar23 = (b->super_Point).y;
  dVar32 = (c->super_Point).x;
  dVar33 = (c->super_Point).y;
  dVar29 = dVar20 - dVar32;
  dVar26 = dVar23 - dVar33;
  dVar4 = cos(theta);
  dVar21 = (dVar4 * lcd) / SQRT(dVar21 * dVar21 + dVar29 * dVar29 + dVar26 * dVar26);
  dVar24 = (c->super_Point).x;
  dVar27 = (c->super_Point).y;
  dVar29 = (c->super_Point).z;
  dVar8 = dVar29 - (dVar3 - dVar2) * dVar21;
  dVar35 = (b->super_Point).x;
  dVar31 = (b->super_Point).y;
  dVar34 = (B->super_Point).x;
  dVar22 = (B->super_Point).y;
  dVar2 = (B->super_Point).z;
  dVar3 = (b->super_Point).z;
  auVar5._8_4_ = SUB84(dVar3,0);
  auVar5._0_8_ = dVar8;
  auVar5._12_4_ = (int)((ulong)dVar3 >> 0x20);
  dVar25 = sin(theta);
  dVar30 = sin(theta);
  dVar3 = (B->super_Point).x;
  dVar4 = (B->super_Point).y;
  dVar26 = (B->super_Point).z;
  Atom::Atom(&local_288,0.0,0.0,0.0,-0x3039);
  Atom::Atom(&local_2d8,0.0,0.0,0.0,-0x3039);
  dVar20 = dVar24 - dVar21 * (dVar32 - dVar20);
  dVar23 = dVar27 - dVar21 * (dVar33 - dVar23);
  dVar24 = dVar24 - dVar35;
  dVar27 = dVar27 - dVar31;
  dStack_320 = auVar5._8_8_;
  dVar29 = dVar29 - dStack_320;
  dVar21 = ((dVar2 - dVar8) * dVar29 + (dVar34 - dVar20) * dVar24 + (dVar22 - dVar23) * dVar27) /
           (dVar29 * dVar29 + dVar24 * dVar24 + dVar27 * dVar27);
  dVar32 = (dVar34 - dVar21 * dVar24) - dVar20;
  dVar33 = (dVar22 - dVar21 * dVar27) - dVar23;
  dVar24 = (dVar2 - dVar29 * dVar21) - dVar8;
  dVar27 = SQRT(dVar24 * dVar24 + dVar32 * dVar32 + dVar33 * dVar33);
  dVar25 = (dVar25 * lcd) / dVar27;
  dVar29 = (dVar30 * lcd) / dVar27;
  dVar21 = (dVar20 - dVar32 * dVar29) - dVar3;
  dVar2 = (dVar23 - dVar33 * dVar29) - dVar4;
  dVar29 = (dVar8 - dVar29 * dVar24) - dVar26;
  dVar35 = lcon - SQRT(dVar29 * dVar29 + dVar21 * dVar21 + dVar2 * dVar2);
  dVar3 = (dVar32 * dVar25 + dVar20) - dVar3;
  dVar4 = (dVar33 * dVar25 + dVar23) - dVar4;
  dVar26 = (dVar25 * dVar24 + dVar8) - dVar26;
  dVar21 = lcon - SQRT(dVar26 * dVar26 + dVar3 * dVar3 + dVar4 * dVar4);
  lVar10 = (long)rem;
  dVar4 = lcon - this->minDistcon[label][lVar10];
  dVar2 = this->minDistdel[label][lVar10];
  dVar3 = this->DistconBy[label][lVar10];
  dVar26 = dVar4 / dVar3 + 1e-05;
  iVar16 = (int)dVar26;
  dVar29 = this->DistdelBy[label][lVar10];
  dVar25 = (double)(int)dVar26 * dVar3;
  iVar14 = (int)((1.0 / dVar29) * (dVar21 - dVar2));
  dVar30 = dVar35 - dVar2;
  dVar26 = dVar3 + dVar25;
  if (dVar30 <= 0.0) {
    local_238[0] = (1.0 / dVar3) *
                   ((dVar26 - dVar4) * this->etedCon[label][lVar10][iVar16][0] +
                   (dVar4 - dVar25) * this->etedCon[label][lVar10][(long)iVar16 + 1][0]);
    dVar30 = 0.0;
    iVar13 = 0;
  }
  else {
    dVar31 = (1.0 / dVar29) * dVar30;
    iVar13 = (int)dVar31;
    dVar34 = ((double)(iVar13 + 1) * dVar29 - dVar35) + dVar2;
    dVar30 = dVar30 - (double)(int)dVar31 * dVar29;
    local_238[iVar13] =
         ((dVar4 - dVar25) * this->etedCon[label][lVar10][(long)iVar16 + 1][(long)iVar13 + 1] *
          dVar30 + (dVar26 - dVar4) * this->etedCon[label][lVar10][iVar16][(long)iVar13 + 1] *
                   dVar30 + dVar34 * this->etedCon[label][lVar10][iVar16][iVar13] * (dVar26 - dVar4)
                            + this->etedCon[label][lVar10][(long)iVar16 + 1][iVar13] *
                              (dVar4 - dVar25) * dVar34) / (dVar3 * dVar29);
    dVar30 = dVar29 - dVar30;
  }
  if (iVar14 < 0x1f) {
    iVar12 = iVar14 + 1;
    dVar31 = ((double)iVar12 * dVar29 - dVar21) + dVar2;
    dVar34 = (dVar21 - dVar2) - (double)iVar14 * dVar29;
    dVar31 = this->etedCon[label][lVar10][iVar16][iVar12] * (dVar26 - dVar4) * dVar34 +
             dVar31 * this->etedCon[label][lVar10][iVar16][iVar14] * (dVar26 - dVar4) +
             this->etedCon[label][lVar10][(long)iVar16 + 1][iVar14] * (dVar4 - dVar25) * dVar31;
    local_238[iVar12] =
         (this->etedCon[label][lVar10][(long)iVar16 + 1][iVar12] * (dVar4 - dVar25) * dVar34 +
         dVar31) / (dVar3 * dVar29);
    dVar21 = dVar29 - (((double)iVar12 * dVar29 + dVar2) - dVar21);
  }
  else {
    local_140[0] = (this->etedCon[label][lVar10][iVar16][0x1f] * (dVar26 - dVar4) +
                   this->etedCon[label][lVar10][(long)iVar16 + 1][0x1f] * (dVar4 - dVar25)) *
                   (1.0 / dVar3);
    dVar21 = 0.0;
    iVar12 = 0x1f;
    dVar31 = dVar25;
  }
  dVar22 = (this->etedCon[label][lVar10][iVar16][(long)iVar13 + 1] * (dVar26 - dVar4) +
           this->etedCon[label][lVar10][(long)iVar16 + 1][(long)iVar13 + 1] * (dVar4 - dVar25)) *
           (1.0 / dVar3);
  local_238[(long)iVar13 + 1] = dVar22;
  dVar34 = local_238[iVar13];
  local_140[(long)iVar13 + 1] = 0.0;
  local_140[(long)iVar13 + 2] = (dVar22 + dVar34) * 0.5 * dVar30;
  iVar14 = iVar13 + 2;
  if (iVar14 < iVar12) {
    lVar15 = (long)iVar14;
    dVar34 = local_140[lVar15];
    lVar11 = 0;
    dVar22 = local_238[lVar15 + -1];
    do {
      dVar31 = this->etedCon[label][lVar10][(long)iVar16 + 1][lVar15 + lVar11] * (dVar4 - dVar25);
      dVar28 = (this->etedCon[label][lVar10][iVar16][lVar15 + lVar11] * (dVar26 - dVar4) + dVar31) *
               (1.0 / dVar3);
      local_238[lVar15 + lVar11] = dVar28;
      dVar34 = dVar34 + (dVar22 + dVar28) * 0.5 * dVar29;
      local_140[lVar15 + lVar11 + 1] = dVar34;
      lVar1 = lVar15 + lVar11;
      lVar11 = lVar11 + 1;
      dVar22 = dVar28;
    } while (lVar1 + 1 < (long)iVar12);
  }
  lVar10 = (long)iVar12;
  dVar3 = local_140[iVar12];
  dVar4 = (local_238[lVar10] + local_238[(long)iVar12 + -1]) * 0.5 * dVar21 + dVar3;
  local_140[lVar10 + 1] = dVar4;
  iVar16 = rand();
  dVar26 = (((double)iVar16 + 0.5) / 2147483647.0) * dVar4 + 0.0;
  if (dVar26 <= local_140[(long)iVar13 + 2]) {
    dVar31 = dVar35 + (dVar30 * dVar26) / local_140[(long)iVar13 + 2];
  }
  else {
    if (iVar14 < iVar12) {
      lVar11 = (long)iVar14;
      lVar15 = (lVar11 << 0x20) + -0x100000000;
      do {
        if (dVar26 <= local_140[lVar11 + 1]) {
          dVar25 = *(double *)((long)local_140 + (lVar15 >> 0x1d) + 8);
          dVar31 = ((dVar26 - dVar25) * dVar29) / (local_140[lVar11 + 1] - dVar25) +
                   (((double)(int)lVar11 * dVar29 + dVar2) - dVar29);
          break;
        }
        lVar11 = lVar11 + 1;
        lVar15 = lVar15 + 0x100000000;
      } while (lVar11 < lVar10);
    }
    if ((dVar26 <= dVar4) && (dVar3 <= dVar26)) {
      dVar31 = (dVar21 * (dVar26 - dVar3)) / (dVar4 - dVar3) +
               dVar29 * (double)(iVar12 + -1) + dVar2;
    }
  }
  dVar26 = (B->super_Point).x - dVar20;
  dVar4 = (B->super_Point).y - dVar23;
  dVar21 = (B->super_Point).z - dVar8;
  dVar2 = sin(theta);
  dVar3 = sin(theta);
  dVar29 = sin(theta);
  dVar2 = acos(((dVar3 * lcd * lcd * dVar2 + dVar21 * dVar21 + dVar26 * dVar26 + dVar4 * dVar4) -
               (lcon - dVar31) * (lcon - dVar31)) / (dVar29 * (dVar27 + dVar27) * lcd));
  dVar3 = sin(theta);
  dVar29 = cos(dVar2);
  dVar26 = (dVar3 * lcd * dVar29) / dVar27;
  dVar3 = (c->super_Point).y - (b->super_Point).y;
  uVar19 = (uint)((ulong)dVar32 >> 0x20);
  auVar9._8_4_ = SUB84(dVar32,0);
  auVar9._0_8_ = dVar24;
  auVar9._12_4_ = uVar19;
  dVar21 = (c->super_Point).z - (b->super_Point).z;
  dVar29 = (c->super_Point).x - (b->super_Point).x;
  auVar6._8_4_ = SUB84(dVar29,0);
  auVar6._0_8_ = dVar21;
  auVar6._12_4_ = (int)((ulong)dVar29 >> 0x20);
  dVar29 = sin(theta);
  dVar4 = sin(dVar2);
  dVar25 = (c->super_Point).x - (b->super_Point).x;
  dVar30 = (c->super_Point).y - (b->super_Point).y;
  dVar35 = (c->super_Point).z - (b->super_Point).z;
  dVar29 = (dVar4 * dVar29 * lcd) /
           (SQRT(dVar35 * dVar35 + dVar25 * dVar25 + dVar30 * dVar30) * dVar27);
  dStack_340 = auVar6._8_8_;
  dStack_3f0 = auVar9._8_8_;
  dVar4 = dVar29 * (dVar24 * dStack_340 - dVar21 * dStack_3f0) + dVar26 * dVar33 + dVar23;
  local_2e8 = (dVar32 * dVar3 - dStack_340 * dVar33) * dVar29 + dVar24 * dVar26 + dVar8;
  local_2f8._8_4_ = SUB84(dVar4,0);
  local_2f8._0_8_ = dVar29 * (dVar33 * dVar21 - dVar3 * dVar24) + dVar26 * dVar32 + dVar20;
  local_2f8._12_4_ = (int)((ulong)dVar4 >> 0x20);
  Atom::operator=(&local_288,(Point *)local_2f8);
  local_3d8 = -dVar24;
  uStack_3d0._0_4_ = SUB84(dVar32,0);
  uStack_3d0._4_4_ = uVar19 ^ 0x80000000;
  local_368 = -dVar33;
  dVar3 = sin(theta);
  dVar29 = cos(dVar2);
  dVar29 = (dVar3 * lcd * dVar29) / dVar27;
  dVar4 = (c->super_Point).y - (b->super_Point).y;
  dVar26 = (c->super_Point).z - (b->super_Point).z;
  dVar3 = (c->super_Point).x - (b->super_Point).x;
  auVar7._8_4_ = SUB84(dVar3,0);
  auVar7._0_8_ = dVar26;
  auVar7._12_4_ = (int)((ulong)dVar3 >> 0x20);
  dVar3 = sin(theta);
  dVar2 = sin(dVar2);
  dVar21 = (c->super_Point).x - (b->super_Point).x;
  dVar25 = (c->super_Point).y - (b->super_Point).y;
  dVar30 = (c->super_Point).z - (b->super_Point).z;
  dVar2 = (dVar2 * dVar3 * lcd) /
          (SQRT(dVar30 * dVar30 + dVar21 * dVar21 + dVar25 * dVar25) * dVar27);
  dStack_3c0 = auVar7._8_8_;
  dVar3 = (dVar23 + dVar29 * dVar33) - dVar2 * (dVar24 * dStack_3c0 + dVar26 * uStack_3d0);
  local_2e8 = (dVar8 + dVar24 * dVar29) - (dStack_3c0 * local_368 + dVar32 * dVar4) * dVar2;
  local_2f8._8_4_ = SUB84(dVar3,0);
  local_2f8._0_8_ = (dVar20 + dVar29 * dVar32) - dVar2 * (dVar33 * dVar26 + dVar4 * local_3d8);
  local_2f8._12_4_ = (int)((ulong)dVar3 >> 0x20);
  Atom::operator=(&local_2d8,(Point *)local_2f8);
  iVar14 = rand();
  uVar17 = 0;
  uVar18 = 0x3fe00000;
  if (label == 0) {
    if (rem < 5) {
      uVar17 = 0xa3d70a4;
      uVar18 = 0x3fe0a3d7;
    }
    else {
      uVar17 = (undefined4)*(undefined8 *)(&DAT_0014d390 + (ulong)((uint)rem < 9) * 8);
      uVar18 = (undefined4)
               ((ulong)*(undefined8 *)(&DAT_0014d390 + (ulong)((uint)rem < 9) * 8) >> 0x20);
    }
  }
  A = &local_288;
  if ((double)CONCAT44(uVar18,uVar17) < ((double)iVar14 + 0.5) / 2147483647.0) {
    A = &local_2d8;
  }
  Atom::operator=(p,A);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._name._M_dataplus._M_p != &local_2d8._name.field_2) {
    operator_delete(local_2d8._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._name._M_dataplus._M_p != &local_288._name.field_2) {
    operator_delete(local_288._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SMC::sample_distance(const Atom &b, const Atom &c, const Atom &B,
                          const double theta, const double lcd,
                          Atom &p, const double lcon,
                          const int label, const int rem) {
    // Find minimal, maximal distances of point B to bond angle circle
    double lbc = b.dis(c);
    Point e = c - (c - b) * (lcd * cos(theta) / lbc);
    Point Bp = B - (c - b) * ((B - e).dot(c - b) / (c - b).square());
    Point mm = e + (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    Point mp = e - (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    double md[2];
    int length = rem;

    md[0] = lcon - mp.dis(B);
    md[1] = lcon - mm.dis(B);
    Atom p1, p2;

    double x = lcon - minDistcon[label][length];
    double distby = DistconBy[label][length];
    double delby = DistdelBy[label][length];
    double mindeld = minDistdel[label][length];

    int conlower = int(x / distby + 0.00001);
    double x1 = conlower * distby;
    double x2 = x1 + distby;
    double d, y, lowgap, highgap = 0;

    int min_intY = int((md[0] - mindeld) * (1 / delby));    // integer lower bound of delta d
    int max_intY = int((md[1] - mindeld) * (1 / delby)) + 1;    // integer upper bound of delta d


    double denominator = distby * delby;
    double cdf[32];
    double pdf[32];

    if (md[0] - mindeld <= 0) {
        min_intY = 0;
        pdf[min_intY] =
                ((x2 - x) * etedCon[label][length][conlower][0] + (x - x1) * etedCon[label][length][conlower + 1][0]) *
                (1 / distby);
        lowgap = 0;
    }
    else {
        pdf[min_intY] =
                (etedCon[label][length][conlower][min_intY] * (x2 - x) * (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower + 1][min_intY] * (x - x1) *
                 (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower][min_intY + 1] * (x2 - x) * (md[0] - mindeld - delby * min_intY) +
                 etedCon[label][length][conlower + 1][min_intY + 1] * (x - x1) * (md[0] - mindeld - delby * min_intY)) /
                denominator;
        lowgap = delby - (md[0] - mindeld - delby * min_intY);
    }

    if (max_intY > 31) {
        max_intY = 31;
        pdf[max_intY] = ((x2 - x) * etedCon[label][length][conlower][31] +
                         (x - x1) * etedCon[label][length][conlower + 1][31]) * (1 / distby);
        highgap = 0;
    }
    else {
        pdf[max_intY] =
                (etedCon[label][length][conlower][max_intY - 1] * (x2 - x) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower + 1][max_intY - 1] * (x - x1) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower][max_intY] * (x2 - x) * (md[1] - mindeld - delby * (max_intY - 1)) +
                 etedCon[label][length][conlower + 1][max_intY] * (x - x1) *
                 (md[1] - mindeld - delby * (max_intY - 1))) / denominator;

        highgap = delby - (mindeld + delby * max_intY - md[1]);
    }


    int floor = min_intY + 1;
    pdf[floor] = ((x2 - x) * etedCon[label][length][conlower][floor] +
                  (x - x1) * etedCon[label][length][conlower + 1][floor]) * (1 / distby);
    cdf[min_intY] = 0;

    cdf[floor] = (pdf[floor] + pdf[min_intY]) * 0.5 * lowgap;


    for (int i = floor + 1; i < max_intY; i++) {
        pdf[i] = ((x2 - x) * etedCon[label][length][conlower][i] + (x - x1) * etedCon[label][length][conlower + 1][i]) *
                 (1 / distby);
        cdf[i] = cdf[i - 1] + (pdf[i] + pdf[i - 1]) * 0.5 * delby;
    }

    cdf[max_intY] = cdf[max_intY - 1] + (pdf[max_intY] + pdf[max_intY - 1]) * 0.5 * highgap;


    double randr = frand(0, cdf[max_intY]);

    double c1, c2 = 0;
    if (randr <= cdf[floor]) {
        c1 = randr;
        c2 = cdf[floor];
        y = md[0] + c1 * lowgap / c2;
    }
    else {
        for (int i = floor + 1; i < max_intY; i++) {
            if (randr <= cdf[i]) {
                c1 = randr - cdf[i - 1];
                c2 = cdf[i] - cdf[i - 1];
                y = mindeld + delby * i - delby + c1 * delby / c2;
                break;
            }
        }
        if (randr <= cdf[max_intY] && randr >= cdf[max_intY - 1]) {
            c1 = randr - cdf[max_intY - 1];
            c2 = cdf[max_intY] - cdf[max_intY - 1];
            y = mindeld + delby * (max_intY - 1) + c1 * highgap / c2;
        }
    }
    d = lcon - y;

    // Find points on bond angle circle corresponding to distances
    double gamma = acos(((B - e).square() + lcd * lcd * sin(theta) * sin(theta) - d * d) /
                        (2 * Bp.dis(e) * lcd * sin(theta)));
    p1 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) +
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));
    p2 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) -
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));

    double frand_chose = frand(0, 1);
    double threshold = 0.5;
    if (label == 0) {
        if (rem <= 4)
            threshold = 0.52;
        else if (rem > 4 && rem <= 8)
            threshold = 0.51;
        else
            threshold = 0.5;
    }
    if (frand_chose <= threshold)
        p = p1;
    else
        p = p2;
}